

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

void pnga_access_ghost_ptr(Integer g_a,Integer *dims,void *ptr,Integer *ld)

{
  short sVar1;
  ushort uVar2;
  int iVar3;
  C_Integer *pCVar4;
  global_array_t *pgVar5;
  Integer proc;
  Integer IVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  C_Integer CVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  int _ndim;
  ulong uVar16;
  int _index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer hi [7];
  Integer lo [7];
  int local_180;
  int local_158 [10];
  undefined8 *local_130;
  long local_128 [8];
  long local_e8 [8];
  Integer local_a8 [8];
  Integer local_68 [7];
  
  lVar7 = g_a + 1000;
  sVar1 = GA[lVar7].ndim;
  lVar12 = (long)sVar1;
  local_130 = (undefined8 *)ptr;
  proc = pnga_nodeid();
  pnga_distribution(g_a,proc,local_68,local_a8);
  if (0 < lVar12) {
    memset(dims,0,lVar12 * 8);
  }
  pgVar5 = GA;
  uVar2 = GA[lVar7].ndim;
  uVar16 = (ulong)(short)uVar2;
  iVar8 = GA[lVar7].distr_type;
  local_180 = (int)proc;
  if (iVar8 - 1U < 3) {
    uVar9 = (long)local_180 % GA[lVar7].num_blocks[0];
    local_158[0] = (int)uVar9;
    if (1 < (short)uVar2) {
      uVar9 = uVar9 & 0xffffffff;
      lVar15 = 0;
      IVar6 = proc;
      do {
        IVar6 = (long)((int)IVar6 - (int)uVar9) / GA[g_a + 1000].num_blocks[lVar15];
        uVar9 = (long)(int)IVar6 % GA[g_a + 1000].num_blocks[lVar15 + 1];
        local_158[lVar15 + 1] = (int)uVar9;
        lVar15 = lVar15 + 1;
      } while ((uVar16 & 0xffffffff) - 1 != lVar15);
    }
    if (0 < (short)uVar2) {
      lVar15 = 0;
      do {
        iVar8 = *(int *)((long)local_158 + lVar15);
        lVar10 = *(long *)((long)GA[g_a + 1000].block_dims + lVar15 * 2);
        *(long *)((long)local_e8 + lVar15 * 2) = lVar10 * iVar8 + 1;
        lVar10 = ((long)iVar8 + 1) * lVar10;
        *(long *)((long)local_128 + lVar15 * 2) = lVar10;
        lVar13 = *(long *)((long)GA[g_a + 1000].dims + lVar15 * 2);
        if (lVar13 <= lVar10) {
          lVar10 = lVar13;
        }
        *(long *)((long)local_128 + lVar15 * 2) = lVar10;
        lVar15 = lVar15 + 4;
      } while ((uVar16 & 0xffffffff) << 2 != lVar15);
    }
    goto LAB_00178c19;
  }
  if (iVar8 == 4) {
    uVar9 = (long)local_180 % GA[lVar7].num_blocks[0];
    local_158[0] = (int)uVar9;
    if (1 < (short)uVar2) {
      uVar9 = uVar9 & 0xffffffff;
      lVar15 = 0;
      IVar6 = proc;
      do {
        IVar6 = (long)((int)IVar6 - (int)uVar9) / GA[g_a + 1000].num_blocks[lVar15];
        uVar9 = (long)(int)IVar6 % GA[g_a + 1000].num_blocks[lVar15 + 1];
        local_158[lVar15 + 1] = (int)uVar9;
        lVar15 = lVar15 + 1;
      } while ((uVar16 & 0xffffffff) - 1 != lVar15);
    }
    if (0 < (short)uVar2) {
      pCVar4 = GA[lVar7].mapc;
      lVar15 = 0;
      iVar8 = 0;
      do {
        iVar3 = *(int *)((long)local_158 + lVar15);
        lVar10 = (long)iVar8 + (long)iVar3;
        *(C_Integer *)((long)local_e8 + lVar15 * 2) = pCVar4[lVar10];
        if ((long)iVar3 < *(long *)((long)GA[lVar7].num_blocks + lVar15 * 2) + -1) {
          lVar10 = GA[lVar7].mapc[lVar10 + 1] + -1;
        }
        else {
          lVar10 = *(long *)((long)GA[lVar7].dims + lVar15 * 2);
        }
        *(long *)((long)local_128 + lVar15 * 2) = lVar10;
        iVar8 = iVar8 + *(int *)((long)GA[lVar7].num_blocks + lVar15 * 2);
        lVar15 = lVar15 + 4;
      } while ((uVar16 & 0xffffffff) << 2 != lVar15);
    }
    goto LAB_00178c19;
  }
  if (iVar8 != 0) goto LAB_00178c19;
  if (GA[lVar7].num_rstrctd == 0) {
    if ((short)uVar2 < 1) {
      lVar15 = 1;
    }
    else {
      lVar15 = 1;
      uVar9 = 0;
      do {
        lVar15 = lVar15 * GA[g_a + 1000].nblock[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar16 != uVar9);
    }
    if ((-1 < proc) && (proc < lVar15)) {
      if (0 < (short)uVar2) {
        pCVar4 = GA[lVar7].mapc;
        uVar9 = 0;
        lVar15 = 0;
        IVar6 = proc;
        do {
          lVar13 = (long)GA[g_a + 1000].nblock[uVar9];
          lVar10 = IVar6 % lVar13;
          local_e8[uVar9] = pCVar4[lVar10 + lVar15];
          if (lVar10 == lVar13 + -1) {
            CVar11 = GA[g_a + 1000].dims[uVar9];
          }
          else {
            CVar11 = pCVar4[lVar10 + lVar15 + 1] + -1;
          }
          lVar15 = lVar15 + lVar13;
          local_128[uVar9] = CVar11;
          uVar9 = uVar9 + 1;
          IVar6 = IVar6 / lVar13;
        } while (uVar16 != uVar9);
      }
      goto LAB_00178c19;
    }
LAB_00178bdf:
    if ((short)uVar2 < 1) goto LAB_00178c19;
    memset(local_e8,0,uVar16 << 3);
  }
  else {
    if (proc < GA[lVar7].num_rstrctd) {
      if ((short)uVar2 < 1) {
        lVar15 = 1;
      }
      else {
        lVar15 = 1;
        uVar9 = 0;
        do {
          lVar15 = lVar15 * GA[g_a + 1000].nblock[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar16 != uVar9);
      }
      if ((-1 < proc) && (proc < lVar15)) {
        if (0 < (short)uVar2) {
          pCVar4 = GA[lVar7].mapc;
          lVar15 = 0;
          uVar9 = 0;
          IVar6 = proc;
          do {
            lVar13 = (long)GA[g_a + 1000].nblock[uVar9];
            lVar10 = IVar6 % lVar13;
            local_e8[uVar9] = pCVar4[lVar10 + lVar15];
            if (lVar10 == lVar13 + -1) {
              CVar11 = GA[g_a + 1000].dims[uVar9];
            }
            else {
              CVar11 = pCVar4[lVar10 + lVar15 + 1] + -1;
            }
            lVar15 = lVar15 + lVar13;
            local_128[uVar9] = CVar11;
            uVar9 = uVar9 + 1;
            IVar6 = IVar6 / lVar13;
          } while (uVar16 != uVar9);
        }
        goto LAB_00178c19;
      }
      goto LAB_00178bdf;
    }
    if ((short)uVar2 < 1) goto LAB_00178c19;
    memset(local_e8,0,(ulong)uVar2 << 3);
  }
  memset(local_128,0xff,uVar16 << 3);
LAB_00178c19:
  if (uVar16 == 1) {
    *ld = (local_128[0] - local_e8[0]) + pgVar5[lVar7].width[0] * 2 + 1;
  }
  if ((short)uVar2 < 2) {
    lVar15 = 1;
    lVar10 = 0;
  }
  else {
    lVar15 = 1;
    lVar13 = 0;
    lVar10 = 0;
    do {
      lVar10 = lVar10 + dims[lVar13] * lVar15;
      lVar14 = (local_128[lVar13] - local_e8[lVar13]) + pgVar5[g_a + 1000].width[lVar13] * 2 + 1;
      ld[lVar13] = lVar14;
      lVar15 = lVar15 * lVar14;
      lVar13 = lVar13 + 1;
    } while (uVar16 - 1 != lVar13);
  }
  *local_130 = pgVar5[lVar7].ptr[proc] +
               (long)pgVar5[lVar7].elemsize * (lVar15 * dims[uVar16 - 1] + lVar10);
  pgVar5 = GA;
  if (0 < sVar1) {
    lVar7 = 0;
    do {
      dims[lVar7] = (local_a8[lVar7] - local_68[lVar7]) + pgVar5[g_a + 1000].width[lVar7] * 2 + 1;
      lVar7 = lVar7 + 1;
    } while (lVar12 != lVar7);
  }
  return;
}

Assistant:

void pnga_access_ghost_ptr(Integer g_a, Integer dims[],
                      void* ptr, Integer ld[])

{
char *lptr;
Integer  handle = GA_OFFSET + g_a;
Integer  i, lo[MAXDIM], hi[MAXDIM];
Integer ndim = GA[handle].ndim;
Integer me = pnga_nodeid();


   pnga_distribution(g_a, me, lo, hi);

   for (i=0; i < ndim; i++) {
     dims[i] = 0;
   }

   gam_LocationWithGhosts(me, handle, dims, &lptr, ld);
   *(char**)ptr = lptr; 
   for (i=0; i < ndim; i++)
     dims[i] = hi[i] - lo[i] + 1 + 2*(Integer)GA[handle].width[i];
}